

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluDrawUtil.cpp
# Opt level: O2

int glu::anon_unknown_4::getVtxCompSize(VertexComponentType type)

{
  int iVar1;
  
  iVar1 = 0;
  if (type < VTX_COMP_TYPE_LAST) {
    iVar1 = *(int *)(&DAT_0190c3a8 + (ulong)type * 4);
  }
  return iVar1;
}

Assistant:

static int getVtxCompSize (VertexComponentType type)
{
	switch (type)
	{
		case VTX_COMP_UNSIGNED_INT8:	return 1;
		case VTX_COMP_UNSIGNED_INT16:	return 2;
		case VTX_COMP_UNSIGNED_INT32:	return 4;
		case VTX_COMP_SIGNED_INT8:		return 1;
		case VTX_COMP_SIGNED_INT16:		return 2;
		case VTX_COMP_SIGNED_INT32:		return 4;
		case VTX_COMP_FIXED:			return 4;
		case VTX_COMP_HALF_FLOAT:		return 2;
		case VTX_COMP_FLOAT:			return 4;
		default:
			DE_ASSERT(false);
			return 0;
	}
}